

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

JavascriptArray *
Js::JavascriptArray::GetArrayForArrayOrObjectWithArray
          (Var var,bool *isObjectWithArrayRef,TypeId *arrayTypeIdRef)

{
  ArrayObject *obj;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicObject *this;
  JavascriptArray *pJVar4;
  TypeId TVar5;
  _func_int **pp_Var6;
  
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x298,"(var)","var");
    if (!bVar2) goto LAB_00b7a6e6;
    *puVar3 = 0;
  }
  if (isObjectWithArrayRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x299,"(isObjectWithArrayRef)","isObjectWithArrayRef");
    if (!bVar2) goto LAB_00b7a6e6;
    *puVar3 = 0;
  }
  if (arrayTypeIdRef == (TypeId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x29a,"(arrayTypeIdRef)","arrayTypeIdRef");
    if (!bVar2) {
LAB_00b7a6e6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  *isObjectWithArrayRef = false;
  *arrayTypeIdRef = TypeIds_Undefined;
  bVar2 = VarIs<Js::RecyclableObject>(var);
  if (bVar2) {
    pp_Var6 = *var;
    if (pp_Var6 == (_func_int **)VirtualTableInfo<Js::DynamicObject>::Address) {
      this = VarTo<Js::DynamicObject>(var);
      bVar2 = DynamicObject::HasObjectArray(this);
      obj = *(ArrayObject **)&(this->field_1).field_1;
      if ((obj == (ArrayObject *)0x0 || !bVar2) || (bVar2 = IsNonES5Array(obj), !bVar2)) {
        pJVar4 = (JavascriptArray *)0x0;
      }
      else {
        pJVar4 = VarTo<Js::JavascriptArray,Js::ArrayObject>(obj);
      }
      if (pJVar4 == (JavascriptArray *)0x0) {
        return (JavascriptArray *)0x0;
      }
      *isObjectWithArrayRef = true;
      pp_Var6 = (pJVar4->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
    }
    else {
      pJVar4 = (JavascriptArray *)0x0;
    }
    TVar5 = TypeIds_Array;
    if (((pp_Var6 == (_func_int **)VirtualTableInfo<Js::JavascriptArray>::Address) ||
        (TVar5 = TypeIds_NativeIntArray,
        pp_Var6 == (_func_int **)VirtualTableInfo<Js::JavascriptNativeIntArray>::Address)) ||
       (TVar5 = TypeIds_ArrayLast,
       pp_Var6 == (_func_int **)VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address)) {
      *arrayTypeIdRef = TVar5;
      if (pJVar4 == (JavascriptArray *)0x0) {
        pJVar4 = VarTo<Js::JavascriptArray>(var);
        return pJVar4;
      }
      return pJVar4;
    }
  }
  return (JavascriptArray *)0x0;
}

Assistant:

JavascriptArray *JavascriptArray::GetArrayForArrayOrObjectWithArray(
        const Var var,
        bool *const isObjectWithArrayRef,
        TypeId *const arrayTypeIdRef)
    {
        // This is a helper function used by jitted code. The array checks done here match the array checks done by jitted code
        // (see Lowerer::GenerateArrayTest) to minimize bailouts.

        Assert(var);
        Assert(isObjectWithArrayRef);
        Assert(arrayTypeIdRef);

        *isObjectWithArrayRef = false;
        *arrayTypeIdRef = TypeIds_Undefined;

        if(!VarIs<RecyclableObject>(var))
        {
            return nullptr;
        }

        JavascriptArray *array = nullptr;
        INT_PTR vtable = VirtualTableInfoBase::GetVirtualTable(var);
        if(vtable == VirtualTableInfo<DynamicObject>::Address)
        {
            ArrayObject* objectArray = VarTo<DynamicObject>(var)->GetObjectArray();
            array = (objectArray && IsNonES5Array(objectArray)) ? VarTo<JavascriptArray>(objectArray) : nullptr;
            if(!array)
            {
                return nullptr;
            }
            *isObjectWithArrayRef = true;
            vtable = VirtualTableInfoBase::GetVirtualTable(array);
        }

        if(vtable == VirtualTableInfo<JavascriptArray>::Address)
        {
            *arrayTypeIdRef = TypeIds_Array;
        }
        else if(vtable == VirtualTableInfo<JavascriptNativeIntArray>::Address)
        {
            *arrayTypeIdRef = TypeIds_NativeIntArray;
        }
        else if(vtable == VirtualTableInfo<JavascriptNativeFloatArray>::Address)
        {
            *arrayTypeIdRef = TypeIds_NativeFloatArray;
        }
        else
        {
            return nullptr;
        }

        if(!array)
        {
            array = VarTo<JavascriptArray>(var);
        }
        return array;
    }